

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handleapi.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCloseHandle(CPalThread *pThread,HANDLE hObject)

{
  bool bVar1;
  undefined4 local_1c;
  PAL_ERROR palError;
  HANDLE hObject_local;
  CPalThread *pThread_local;
  
  bVar1 = HandleIsSpecial(hObject);
  if (bVar1) {
    local_1c = CloseSpecialHandle(hObject);
  }
  else {
    local_1c = (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pThread,hObject);
  }
  return local_1c;
}

Assistant:

PAL_ERROR
CorUnix::InternalCloseHandle(
    CPalThread * pThread,
    HANDLE hObject
    )
{
    PAL_ERROR palError = NO_ERROR;

    if (!HandleIsSpecial(hObject))
    {
        palError = g_pObjectManager->RevokeHandle(
            pThread,
            hObject
            );
    }
    else
    {
        palError = CloseSpecialHandle(hObject);
    }

    return palError;
}